

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_a413::createChecksumUsingOriginalConstant
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          ,vector<unsigned_char,_std::allocator<unsigned_char>_> *dp)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  value_type_conflict *__val;
  pointer puVar3;
  byte bVar4;
  long lVar5;
  undefined1 auVar6 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long lVar7;
  
  expandHrp(&local_38,hrp);
  cat(&local_50,&local_38,dp);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_50,
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (6 - (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start));
  uVar2 = polymod((anon_unknown_dwarf_a413 *)
                  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (pointer)operator_new(6);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = puVar3;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar3 + 6;
  puVar3[4] = '\0';
  puVar3[5] = '\0';
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar3 + 6;
  auVar1 = _DAT_00105330;
  lVar5 = 1;
  bVar4 = 0x14;
  auVar6 = _DAT_00105320;
  do {
    if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffffa) {
      puVar3[lVar5 + -1] = (byte)((uVar2 ^ 1) >> (bVar4 + 5 & 0x1f)) & 0x1f;
      puVar3[lVar5] = (byte)((uVar2 ^ 1) >> (bVar4 & 0x1f)) & 0x1f;
    }
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar7 + 2;
    lVar5 = lVar5 + 2;
    bVar4 = bVar4 - 10;
  } while (lVar5 != 7);
  if ((anon_unknown_dwarf_a413 *)
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (anon_unknown_dwarf_a413 *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    createChecksumUsingOriginalConstant(const std::string &hrp, const std::vector<unsigned char> &dp) {
        std::vector<unsigned char> c = cat(expandHrp(hrp), dp);
        c.resize(c.size() + CHECKSUM_LENGTH);
        uint32_t mod = polymod(c) ^ 1;
        std::vector<unsigned char> ret(CHECKSUM_LENGTH);
        for(std::vector<unsigned char>::size_type i = 0; i < CHECKSUM_LENGTH; ++i) {
            ret[i] = static_cast<unsigned char>((mod >> (5 * (5 - i))) & 31u);
        }
        return ret;
    }